

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall soul::AST::QualifiedIdentifier::~QualifiedIdentifier(QualifiedIdentifier *this)

{
  Identifier *pIVar1;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__QualifiedIdentifier_002f5f48;
  (this->pathPrefix).pathSections.numActive = 0;
  if (8 < (this->pathPrefix).pathSections.numAllocated) {
    pIVar1 = (this->pathPrefix).pathSections.items;
    if (pIVar1 != (Identifier *)0x0) {
      operator_delete__(pIVar1);
    }
    (this->pathPrefix).pathSections.items = (Identifier *)(this->pathPrefix).pathSections.space;
    (this->pathPrefix).pathSections.numAllocated = 8;
  }
  std::
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ::~vector(&this->pathSections);
  ASTObject::~ASTObject((ASTObject *)this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

QualifiedIdentifier (const Context& c)
            : Expression (ObjectType::QualifiedIdentifier, c, ExpressionKind::unknown)
        {
        }